

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrContextUtil.cpp
# Opt level: O3

void sglr::drawQuad(Context *ctx,deUint32 program,Vec3 *p0,Vec3 *p1)

{
  ContextType ctxType;
  bool bVar1;
  
  ctxType.super_ApiType.m_bits = (ApiType)(ctx->m_type).super_ApiType.m_bits;
  if (((uint)ctxType.super_ApiType.m_bits & 0x300) != 0x100) {
    bVar1 = glu::contextSupports(ctxType,(ApiType)0x13);
    if (!bVar1) {
      drawQuadWithClientPointers(ctx,program,p0,p1);
      return;
    }
  }
  drawQuadWithVaoBuffers(ctx,program,p0,p1);
  return;
}

Assistant:

void drawQuad (sglr::Context& ctx, deUint32 program, const tcu::Vec3& p0, const tcu::Vec3& p1)
{
	const glu::ContextType	ctxType	= ctx.getType();

	if (glu::isContextTypeGLCore(ctxType) || (contextSupports(ctxType, glu::ApiType::es(3,1))))
		drawQuadWithVaoBuffers(ctx, program, p0, p1);
	else
	{
		DE_ASSERT(isContextTypeES(ctxType));
		drawQuadWithClientPointers(ctx, program, p0, p1);
	}
}